

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::InputFile::Data::~Data(Data *this)

{
  if (this->tFile != (TiledInputFile *)0x0) {
    (*(this->tFile->super_GenericInputFile)._vptr_GenericInputFile[1])();
  }
  if (this->sFile != (ScanLineInputFile *)0x0) {
    (*(this->sFile->super_GenericInputFile)._vptr_GenericInputFile[1])();
  }
  if (this->dsFile != (DeepScanLineInputFile *)0x0) {
    (*(this->dsFile->super_GenericInputFile)._vptr_GenericInputFile[1])();
  }
  if (this->compositor != (CompositeDeepScanLine *)0x0) {
    (*this->compositor->_vptr_CompositeDeepScanLine[1])();
  }
  deleteCachedBuffer(this);
  if ((this->multiPartBackwardSupport == true) && (this->multiPartFile != (MultiPartInputFile *)0x0)
     ) {
    (*(this->multiPartFile->super_GenericInputFile)._vptr_GenericInputFile[1])();
  }
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&this->tFileBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

InputFile::Data::~Data ()
{
    if (tFile)
        delete tFile;
    if (sFile)
        delete sFile;
    if (dsFile)
        delete dsFile;
    if (compositor)
        delete compositor;

    deleteCachedBuffer();

    if (multiPartBackwardSupport && multiPartFile)
        delete multiPartFile;
}